

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O2

void set_get_test(void)

{
  int iVar1;
  bitset_container_t *bitset;
  size_t x_1;
  size_t x;
  ulong uVar2;
  ulong b;
  size_t x_2;
  
  bitset = bitset_container_create();
  _assert_true((unsigned_long)bitset,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x46);
  for (uVar2 = 0; uVar2 != 0x10000; uVar2 = uVar2 + 1) {
    _assert_true((ulong)((bitset->words[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0),
                 "bitset_container_get(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x49);
  }
  for (uVar2 = 0; uVar2 < 0x10000; uVar2 = uVar2 + 3) {
    b = (ulong)(ushort)((ushort)uVar2 / 3);
    _assert_int_equal((long)bitset->cardinality,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                      ,0x4d);
    _assert_true((ulong)((bitset->words[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0),
                 "bitset_container_get(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x4f);
    bitset_container_set(bitset,(ushort)uVar2);
    _assert_true((ulong)((bitset->words[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0),
                 "bitset_container_get(B, x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x51);
    _assert_int_equal((long)bitset->cardinality,b + 1,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                      ,0x53);
  }
  for (uVar2 = 0; uVar2 != 0x10000; uVar2 = uVar2 + 1) {
    _assert_int_equal((ulong)((bitset->words[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0),
                      (ulong)((ushort)((ushort)uVar2 % 3) == 0),
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                      ,0x57);
  }
  _assert_int_equal((long)bitset->cardinality,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x5a);
  iVar1 = bitset_container_compute_cardinality(bitset);
  _assert_int_equal((long)iVar1,0x5556,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x5c);
  for (uVar2 = 0; uVar2 < 0x10000; uVar2 = uVar2 + 3) {
    bitset_container_remove(bitset,(uint16_t)uVar2);
  }
  _assert_int_equal((long)bitset->cardinality,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x62);
  iVar1 = bitset_container_compute_cardinality(bitset);
  _assert_int_equal((long)iVar1,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,99);
  bitset_container_free(bitset);
  return;
}

Assistant:

DEFINE_TEST(set_get_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_false(bitset_container_get(B, x));
    }

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_int_equal(bitset_container_cardinality(B), x / 3);

        assert_false(bitset_container_get(B, x));
        bitset_container_set(B, x);
        assert_true(bitset_container_get(B, x));

        assert_int_equal(bitset_container_cardinality(B), x / 3 + 1);
    }

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(bitset_container_get(B, x), (x / 3 * 3 == x));
    }

    assert_int_equal(bitset_container_cardinality(B), (1 << 16) / 3 + 1);
    assert_int_equal(bitset_container_compute_cardinality(B),
                     (1 << 16) / 3 + 1);

    for (size_t x = 0; x < 1 << 16; x += 3) {
        bitset_container_remove(B, x);
    }

    assert_int_equal(bitset_container_cardinality(B), 0);
    assert_int_equal(bitset_container_compute_cardinality(B), 0);

    bitset_container_free(B);
}